

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined4 _x;
  undefined4 _x_00;
  ImVec2 IVar1;
  undefined4 _y;
  undefined4 _y_00;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ImDrawIdx IVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  ImVec2 *pIVar9;
  ImVec2 *pIVar10;
  ImVec4 *pIVar11;
  ImDrawIdx IVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImVec2 IVar20;
  undefined8 uStackY_2d0;
  ImVec2 IStackY_2c8;
  ImVec2 IStackY_2c0;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  ImDrawList *in_stack_fffffffffffffd50;
  uint local_268;
  int local_264;
  float local_240;
  int local_23c;
  byte local_231;
  uint local_230;
  uint local_22c;
  int local_21c;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1e8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_2;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_lensq_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  int points_last;
  float half_inner_thickness;
  int i_1;
  int i;
  ImVec2 tex_uv1;
  ImVec2 tex_uv0;
  ImVec4 tex_uvs;
  ImVec2 *out_vtx;
  float local_e0;
  float inv_lensq;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  float half_draw_size;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  bool use_texture;
  float fractional_thickness;
  int integer_thickness;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 opaque_uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    local_21c = points_count;
    if (!closed) {
      local_21c = points_count + -1;
    }
    bVar3 = 1.0 < thickness;
    if ((this->Flags & 1U) == 0) {
      uStackY_2d0 = 0x157885;
      PrimReserve(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
      for (local_1e8 = 0; local_1e8 < local_21c; local_1e8 = local_1e8 + 1) {
        if (local_1e8 + 1 == points_count) {
          IStackY_2c0.y = 0.0;
        }
        else {
          IStackY_2c0.y = (float)(local_1e8 + 1);
        }
        pIVar9 = points + local_1e8;
        pIVar10 = points + (int)IStackY_2c0.y;
        d2_3 = pIVar10->x - pIVar9->x;
        inv_len_1 = pIVar10->y - pIVar9->y;
        fVar15 = d2_3 * d2_3 + inv_len_1 * inv_len_1;
        if (0.0 < fVar15) {
          uStackY_2d0 = 0x15798e;
          fVar15 = sqrtf(fVar15);
          d2_3 = (1.0 / fVar15) * d2_3;
          inv_len_1 = (1.0 / fVar15) * inv_len_1;
        }
        fVar15 = thickness * 0.5 * d2_3;
        fVar16 = thickness * 0.5 * inv_len_1;
        (this->_VtxWritePtr->pos).x = pIVar9->x + fVar16;
        (this->_VtxWritePtr->pos).y = pIVar9->y - fVar15;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = pIVar10->x + fVar16;
        this->_VtxWritePtr[1].pos.y = pIVar10->y - fVar15;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos.x = pIVar10->x - fVar16;
        this->_VtxWritePtr[2].pos.y = pIVar10->y + fVar15;
        this->_VtxWritePtr[2].uv = IVar1;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos.x = pIVar9->x - fVar16;
        this->_VtxWritePtr[3].pos.y = pIVar9->y + fVar15;
        this->_VtxWritePtr[3].uv = IVar1;
        this->_VtxWritePtr[3].col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 4;
        *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + 1;
        this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[3] = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[4] = (short)this->_VtxCurrentIdx + 2;
        this->_IdxWritePtr[5] = (short)this->_VtxCurrentIdx + 3;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
      }
    }
    else {
      uVar6 = col & 0xffffff;
      uStackY_2d0 = 0x15641d;
      fVar15 = ImMax<float>(thickness,1.0);
      iVar13 = (int)fVar15;
      bVar2 = false;
      if (((this->Flags & 2U) != 0) && (bVar2 = false, iVar13 < 0x3f)) {
        bVar2 = fVar15 - (float)iVar13 <= 1e-05;
      }
      if (bVar2) {
        local_22c = points_count << 1;
      }
      else {
        if (bVar3) {
          local_230 = points_count << 2;
        }
        else {
          local_230 = points_count * 3;
        }
        local_22c = local_230;
      }
      uStackY_2d0 = 0x156520;
      PrimReserve(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
      local_231 = 1;
      if (!bVar2) {
        local_231 = bVar3 ^ 0xff;
      }
      lVar4 = -((long)(int)(points_count * (((byte)~local_231 & 1) * 2 + 3)) * 8 + 0xfU &
               0xfffffffffffffff0);
      puVar8 = (undefined8 *)((long)&IStackY_2c8 + lVar4);
      pIVar9 = (ImVec2 *)(puVar8 + points_count);
      for (dx = 0.0; (int)dx < local_21c; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_23c = 0;
        }
        else {
          local_23c = (int)dx + 1;
        }
        d2 = points[local_23c].x - points[(int)dx].x;
        inv_len = points[local_23c].y - points[(int)dx].y;
        fVar16 = d2 * d2 + inv_len * inv_len;
        if (0.0 < fVar16) {
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156642;
          fVar16 = sqrtf(fVar16);
          d2 = (1.0 / fVar16) * d2;
          inv_len = (1.0 / fVar16) * inv_len;
        }
        *(float *)(puVar8 + (int)dx) = inv_len;
        *(float *)((long)&IStackY_2c8 + (long)(int)dx * 8 + lVar4 + 4) = -d2;
      }
      if (!closed) {
        puVar8[points_count + -1] = puVar8[points_count + -2];
      }
      if ((bVar2) || (!bVar3)) {
        if (bVar2) {
          local_240 = fVar15 * 0.5 + 1.0;
        }
        else {
          local_240 = 1.0;
        }
        if (!closed) {
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x15675d;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156778;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          *pIVar9 = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1567a7;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1567c2;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[1] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156802;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x15681d;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[points_count * 2 + -2] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156869;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156884;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[(points_count + -1) * 2 + 1] = IVar20;
        }
        i2_1 = this->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < local_21c; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_264 = 0;
          }
          else {
            local_264 = idx2 + 1;
          }
          if (idx2 + 1 == points_count) {
            local_268 = this->_VtxCurrentIdx;
          }
          else {
            iVar14 = 3;
            if (bVar2) {
              iVar14 = 2;
            }
            local_268 = i2_1 + iVar14;
          }
          fVar15 = (*(float *)(puVar8 + (int)idx2) + *(float *)(puVar8 + local_264)) * 0.5;
          fVar16 = (*(float *)((long)&IStackY_2c8 + (long)(int)idx2 * 8 + lVar4 + 4) +
                   *(float *)((long)&IStackY_2c8 + (long)local_264 * 8 + lVar4 + 4)) * 0.5;
          local_e0 = fVar15 * fVar15 + fVar16 * fVar16;
          if (local_e0 < 0.5) {
            local_e0 = 0.5;
          }
          fVar15 = local_240 * (1.0 / local_e0) * fVar15;
          fVar16 = local_240 * (1.0 / local_e0) * fVar16;
          pIVar10 = pIVar9 + (local_264 << 1);
          pIVar10->x = points[local_264].x + fVar15;
          pIVar10->y = points[local_264].y + fVar16;
          pIVar10[1].x = points[local_264].x - fVar15;
          pIVar10[1].y = points[local_264].y - fVar16;
          IVar12 = (ImDrawIdx)local_268;
          IVar5 = (ImDrawIdx)i2_1;
          if (bVar2) {
            *this->_IdxWritePtr = IVar12;
            this->_IdxWritePtr[1] = IVar5;
            this->_IdxWritePtr[2] = IVar5 + 1;
            this->_IdxWritePtr[3] = IVar12 + 1;
            this->_IdxWritePtr[4] = IVar5 + 1;
            this->_IdxWritePtr[5] = IVar12;
            this->_IdxWritePtr = this->_IdxWritePtr + 6;
          }
          else {
            *this->_IdxWritePtr = IVar12;
            this->_IdxWritePtr[1] = IVar5;
            this->_IdxWritePtr[2] = IVar5 + 2;
            this->_IdxWritePtr[3] = IVar5 + 2;
            this->_IdxWritePtr[4] = IVar12 + 2;
            this->_IdxWritePtr[5] = IVar12;
            this->_IdxWritePtr[6] = IVar12 + 1;
            this->_IdxWritePtr[7] = IVar5 + 1;
            this->_IdxWritePtr[8] = IVar5;
            this->_IdxWritePtr[9] = IVar5;
            this->_IdxWritePtr[10] = IVar12;
            this->_IdxWritePtr[0xb] = IVar12 + 1;
            this->_IdxWritePtr = this->_IdxWritePtr + 0xc;
          }
          i2_1 = local_268;
        }
        if (bVar2) {
          pIVar11 = this->_Data->TexUvLines + iVar13;
          _x = pIVar11->x;
          _y = pIVar11->y;
          _x_00 = pIVar11->z;
          _y_00 = pIVar11->w;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156d42;
          ImVec2::ImVec2(&tex_uv1,(float)_x,(float)_y);
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156d5e;
          ImVec2::ImVec2((ImVec2 *)&i_1,(float)_x_00,(float)_y_00);
          for (half_inner_thickness = 0.0; (int)half_inner_thickness < points_count;
              half_inner_thickness = (float)((int)half_inner_thickness + 1)) {
            this->_VtxWritePtr->pos = pIVar9[(int)half_inner_thickness << 1];
            this->_VtxWritePtr->uv = tex_uv1;
            this->_VtxWritePtr->col = col;
            this->_VtxWritePtr[1].pos = pIVar9[(int)half_inner_thickness * 2 + 1];
            this->_VtxWritePtr[1].uv = _i_1;
            this->_VtxWritePtr[1].col = col;
            this->_VtxWritePtr = this->_VtxWritePtr + 2;
          }
        }
        else {
          for (points_last = 0; points_last < points_count; points_last = points_last + 1) {
            this->_VtxWritePtr->pos = points[points_last];
            this->_VtxWritePtr->uv = IVar1;
            this->_VtxWritePtr->col = col;
            this->_VtxWritePtr[1].pos = pIVar9[points_last << 1];
            this->_VtxWritePtr[1].uv = IVar1;
            this->_VtxWritePtr[1].col = uVar6;
            this->_VtxWritePtr[2].pos = pIVar9[points_last * 2 + 1];
            this->_VtxWritePtr[2].uv = IVar1;
            this->_VtxWritePtr[2].col = uVar6;
            this->_VtxWritePtr = this->_VtxWritePtr + 3;
          }
        }
      }
      else {
        fVar15 = (fVar15 - 1.0) * 0.5;
        if (!closed) {
          iVar13 = points_count + -1;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156f55;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156f70;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          *pIVar9 = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156fa2;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156fbd;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[1] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x156ff0;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x15700b;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[2] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x15704a;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x157065;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[3] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1570b3;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1570ce;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[iVar13 * 4] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x15711c;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x157137;
          IVar20 = operator+((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[(long)(iVar13 * 4) + 1] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x157186;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1571a1;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[(long)(iVar13 * 4) + 2] = IVar20;
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x1571fc;
          operator*((ImVec2 *)*puVar8,*(float *)((long)&uStackY_2d0 + lVar4 + 4));
          *(undefined8 *)((long)&uStackY_2d0 + lVar4) = 0x157217;
          IVar20 = operator-((ImVec2 *)*puVar8,*(ImVec2 **)((long)&uStackY_2d0 + lVar4));
          pIVar9[iVar13 * 4 + 3] = IVar20;
        }
        i2_2 = this->_VtxCurrentIdx;
        for (idx2_1 = 0; (int)idx2_1 < local_21c; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            iVar13 = 0;
          }
          else {
            iVar13 = idx2_1 + 1;
          }
          if (idx2_1 + 1 == points_count) {
            uVar7 = this->_VtxCurrentIdx;
          }
          else {
            uVar7 = i2_2 + 4;
          }
          fVar16 = (*(float *)(puVar8 + (int)idx2_1) + *(float *)(puVar8 + iVar13)) * 0.5;
          fVar17 = (*(float *)((long)&IStackY_2c8 + (long)(int)idx2_1 * 8 + lVar4 + 4) +
                   *(float *)((long)&IStackY_2c8 + (long)iVar13 * 8 + lVar4 + 4)) * 0.5;
          dm_out_x = fVar16 * fVar16 + fVar17 * fVar17;
          if (dm_out_x < 0.5) {
            dm_out_x = 0.5;
          }
          fVar16 = (1.0 / dm_out_x) * fVar16;
          fVar17 = (1.0 / dm_out_x) * fVar17;
          fVar18 = fVar16 * (fVar15 + 1.0);
          fVar19 = fVar17 * (fVar15 + 1.0);
          fVar16 = fVar16 * fVar15;
          fVar17 = fVar17 * fVar15;
          pIVar10 = pIVar9 + (iVar13 << 2);
          pIVar10->x = points[iVar13].x + fVar18;
          pIVar10->y = points[iVar13].y + fVar19;
          pIVar10[1].x = points[iVar13].x + fVar16;
          pIVar10[1].y = points[iVar13].y + fVar17;
          pIVar10[2].x = points[iVar13].x - fVar16;
          pIVar10[2].y = points[iVar13].y - fVar17;
          pIVar10[3].x = points[iVar13].x - fVar18;
          pIVar10[3].y = points[iVar13].y - fVar19;
          IVar5 = (ImDrawIdx)uVar7;
          *this->_IdxWritePtr = IVar5 + 1;
          IVar12 = (ImDrawIdx)i2_2;
          this->_IdxWritePtr[1] = IVar12 + 1;
          this->_IdxWritePtr[2] = IVar12 + 2;
          this->_IdxWritePtr[3] = IVar12 + 2;
          this->_IdxWritePtr[4] = IVar5 + 2;
          this->_IdxWritePtr[5] = IVar5 + 1;
          this->_IdxWritePtr[6] = IVar5 + 1;
          this->_IdxWritePtr[7] = IVar12 + 1;
          this->_IdxWritePtr[8] = IVar12;
          this->_IdxWritePtr[9] = IVar12;
          this->_IdxWritePtr[10] = IVar5;
          this->_IdxWritePtr[0xb] = IVar5 + 1;
          this->_IdxWritePtr[0xc] = IVar5 + 2;
          this->_IdxWritePtr[0xd] = IVar12 + 2;
          this->_IdxWritePtr[0xe] = IVar12 + 3;
          this->_IdxWritePtr[0xf] = IVar12 + 3;
          this->_IdxWritePtr[0x10] = IVar5 + 3;
          this->_IdxWritePtr[0x11] = IVar5 + 2;
          this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
          i2_2 = uVar7;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          this->_VtxWritePtr->pos = pIVar9[vtx_count_1 << 2];
          this->_VtxWritePtr->uv = IVar1;
          this->_VtxWritePtr->col = uVar6;
          this->_VtxWritePtr[1].pos = pIVar9[vtx_count_1 * 4 + 1];
          this->_VtxWritePtr[1].uv = IVar1;
          this->_VtxWritePtr[1].col = col;
          this->_VtxWritePtr[2].pos = pIVar9[vtx_count_1 * 4 + 2];
          this->_VtxWritePtr[2].uv = IVar1;
          this->_VtxWritePtr[2].col = col;
          this->_VtxWritePtr[3].pos = pIVar9[vtx_count_1 * 4 + 3];
          this->_VtxWritePtr[3].uv = IVar1;
          this->_VtxWritePtr[3].col = uVar6;
          this->_VtxWritePtr = this->_VtxWritePtr + 4;
        }
      }
      this->_VtxCurrentIdx = (local_22c & 0xffff) + this->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > 1.0f);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}